

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_MeshComponentRef * __thiscall
ON_MeshTopology::MeshComponentRef
          (ON_MeshComponentRef *__return_storage_ptr__,ON_MeshTopology *this,ON_COMPONENT_INDEX ci)

{
  ON_MeshComponentRef OStack_38;
  
  ON_MeshComponentRef::ON_MeshComponentRef(__return_storage_ptr__);
  if (this->m_mesh != (ON_Mesh *)0x0) {
    ON_Mesh::MeshComponentRef(&OStack_38,this->m_mesh,ci);
    if (&OStack_38 != __return_storage_ptr__) {
      ON_Object::operator=((ON_Object *)__return_storage_ptr__,(ON_Object *)&OStack_38);
      __return_storage_ptr__->m_mesh = OStack_38.m_mesh;
      __return_storage_ptr__->m_mesh_ci = OStack_38.m_mesh_ci;
    }
    ON_MeshComponentRef::~ON_MeshComponentRef(&OStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_MeshComponentRef ON_MeshTopology::MeshComponentRef(ON_COMPONENT_INDEX ci) const
{
  ON_MeshComponentRef cr;
  if ( 0 != m_mesh )
    cr = m_mesh->MeshComponentRef(ci);
  return cr;
}